

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O3

void __thiscall boost::unit_test::decorator::fixture_t::~fixture_t(fixture_t *this)

{
  (this->super_base)._vptr_base = (_func_int **)&PTR_apply_001c8a38;
  detail::shared_count::~shared_count(&(this->m_impl).pn);
  operator_delete(this,0x18);
  return;
}

Assistant:

class BOOST_TEST_DECL fixture_t : public decorator::base {
public:
    // Constructor
    explicit                fixture_t( test_unit_fixture_ptr impl ) : m_impl( impl ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new fixture_t( m_impl )); }

    // Data members
    test_unit_fixture_ptr m_impl;
}